

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void __thiscall
RPCHelpMan::RPCHelpMan
          (RPCHelpMan *this,string *name,string *description,
          vector<RPCArg,_std::allocator<RPCArg>_> *args,RPCResults *results,RPCExamples *examples)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  RPCExamples *in_stack_00000010;
  RPCResults *in_stack_00000018;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_00000020;
  string *in_stack_00000028;
  string *in_stack_00000030;
  RPCHelpMan *in_stack_00000038;
  RPCMethodImpl *in_stack_00000130;
  RPCExamples *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  nullptr_t in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [5];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_ffffffffffffff08,in_R8);
  std::__cxx11::string::string(in_stack_ffffffffffffff08,in_R8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffec8,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)0x19b1269);
  RPCResults::RPCResults((RPCResults *)in_stack_fffffffffffffec8,(RPCResults *)0x19b127b);
  RPCExamples::RPCExamples(in_stack_fffffffffffffec8,(RPCExamples *)0x19b128f);
  this_00 = local_b8;
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00,
             in_stack_fffffffffffffed0);
  this_01 = this_00;
  RPCHelpMan(in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020,
             in_stack_00000018,in_stack_00000010,in_stack_00000130);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  RPCResults::~RPCResults((RPCResults *)this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)this_01);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan::RPCHelpMan(std::string name, std::string description, std::vector<RPCArg> args, RPCResults results, RPCExamples examples)
    : RPCHelpMan{std::move(name), std::move(description), std::move(args), std::move(results), std::move(examples), nullptr} {}